

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::PatchPutRootValueNoFastPath
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  ImplicitCallFlags *pIVar1;
  BOOL BVar2;
  ScriptContext *requestContext;
  RecyclableObject *object;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  
  info._56_8_ = newValue;
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  object = VarTo<Js::RecyclableObject>(instance);
  local_88 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
  BVar2 = SetProperty_Internal<false>
                    (object,object,true,propertyId,(Var)info._56_8_,(PropertyValueInfo *)local_88,
                     requestContext,flags);
  if (BVar2 == 0) {
    pIVar1 = &requestContext->threadContext->implicitCallFlags;
    *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
  }
  return;
}

Assistant:

void JavascriptOperators::PatchPutRootValueNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = VarTo<RecyclableObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        if (!JavascriptOperators::SetRootProperty(object, propertyId, newValue, &info, scriptContext, flags))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
    }